

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O0

void test_bhdct_delete_then_insert(planck_unit_test_t *tc)

{
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined1 local_78 [8];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  planck_unit_test_t *tc_local;
  
  bhdct_setup(tc,(ion_dictionary_handler_t *)&dict.handler,(ion_dictionary_t *)local_78,
              ion_fill_edge_cases);
  local_7c = 0x3c;
  bhdct_delete(tc,(ion_dictionary_t *)local_78,&local_7c,'\0',1,'\x01');
  local_80 = 4;
  bhdct_delete(tc,(ion_dictionary_t *)local_78,&local_80,'\0',1,'\x01');
  local_84 = 0x1f9;
  bhdct_delete(tc,(ion_dictionary_t *)local_78,&local_84,'\0',1,'\x01');
  local_88 = 0x3d;
  local_8c = 0x2c;
  bhdct_insert(tc,(ion_dictionary_t *)local_78,&local_88,&local_8c,'\x01');
  local_90 = 0x43;
  local_94 = 0x2a;
  bhdct_insert(tc,(ion_dictionary_t *)local_78,&local_90,&local_94,'\x01');
  local_98 = 0x49;
  local_9c = 0x30;
  bhdct_insert(tc,(ion_dictionary_t *)local_78,&local_98,&local_9c,'\x01');
  bhdct_takedown(tc,(ion_dictionary_t *)local_78);
  return;
}

Assistant:

void
test_bhdct_delete_then_insert(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_edge_cases);

	bhdct_delete(tc, &dict, IONIZE(60, int), err_ok, 1, boolean_true);
	bhdct_delete(tc, &dict, IONIZE(4, int), err_ok, 1, boolean_true);
	bhdct_delete(tc, &dict, IONIZE(505, int), err_ok, 1, boolean_true);

	bhdct_insert(tc, &dict, IONIZE(61, int), IONIZE(44, int), boolean_true);
	bhdct_insert(tc, &dict, IONIZE(67, int), IONIZE(42, int), boolean_true);
	bhdct_insert(tc, &dict, IONIZE(73, int), IONIZE(48, int), boolean_true);

	bhdct_takedown(tc, &dict);
}